

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_option_desc_abi_cxx11_(Formatter *this,Option *opt)

{
  string *psVar1;
  Option *in_RDX;
  string *in_RDI;
  
  psVar1 = Option::get_description_abi_cxx11_(in_RDX);
  ::std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_desc(const Option *opt) const { return opt->get_description(); }